

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O1

void __thiscall vigra::BmpDecoder::~BmpDecoder(BmpDecoder *this)

{
  ~BmpDecoder(this);
  operator_delete(this);
  return;
}

Assistant:

BmpDecoder::~BmpDecoder()
{
    delete pimpl;
}